

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::CreateTexture_3DGS_MDL4
          (MDLImporter *this,uchar *szData,uint iType,uint *piSkip)

{
  uint uVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  Logger *this_00;
  aiTexture *this_01;
  aiTexture **ppaVar4;
  ulong uVar5;
  aiTexture **ppaVar6;
  uint local_4c;
  uint i;
  aiTexture **pc;
  aiTexture *pcNew;
  bool bNoRead;
  Header *pcHeader;
  uint *piSkip_local;
  uint iType_local;
  uchar *szData_local;
  MDLImporter *this_local;
  
  if (piSkip == (uint *)0x0) {
    __assert_fail("__null != piSkip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0xb8,
                  "void Assimp::MDLImporter::CreateTexture_3DGS_MDL4(const unsigned char *, unsigned int, unsigned int *)"
                 );
  }
  puVar2 = this->mBuffer;
  if ((iType == 1) || (3 < iType)) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"Unsupported texture file format");
  }
  else {
    uVar1 = *piSkip;
    this_01 = (aiTexture *)operator_new(0x428);
    aiTexture::aiTexture(this_01);
    this_01->mWidth = *(uint *)(puVar2 + 0x34);
    this_01->mHeight = *(uint *)(puVar2 + 0x38);
    if (uVar1 == 0xffffffff) {
      this_01->pcData = (aiTexel *)0xffffffffffffffff;
    }
    ParseTextureColorData(this,szData,iType,piSkip,this_01);
    if (uVar1 == 0xffffffff) {
      this_01->pcData = (aiTexel *)0x0;
      if (this_01 != (aiTexture *)0x0) {
        aiTexture::~aiTexture(this_01);
        operator_delete(this_01,0x428);
      }
    }
    else if (this->pScene->mNumTextures == 0) {
      this->pScene->mNumTextures = 1;
      ppaVar4 = (aiTexture **)operator_new__(8);
      this->pScene->mTextures = ppaVar4;
      *this->pScene->mTextures = this_01;
    }
    else {
      ppaVar4 = this->pScene->mTextures;
      auVar3 = ZEXT416(this->pScene->mNumTextures + 1) * ZEXT816(8);
      uVar5 = auVar3._0_8_;
      if (auVar3._8_8_ != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      ppaVar6 = (aiTexture **)operator_new__(uVar5);
      this->pScene->mTextures = ppaVar6;
      for (local_4c = 0; local_4c < this->pScene->mNumTextures; local_4c = local_4c + 1) {
        this->pScene->mTextures[local_4c] = ppaVar4[local_4c];
      }
      this->pScene->mTextures[this->pScene->mNumTextures] = this_01;
      this->pScene->mNumTextures = this->pScene->mNumTextures + 1;
      if (ppaVar4 != (aiTexture **)0x0) {
        operator_delete__(ppaVar4);
      }
    }
  }
  return;
}

Assistant:

void MDLImporter::CreateTexture_3DGS_MDL4(const unsigned char* szData,
    unsigned int iType,
     unsigned int* piSkip)
{
    ai_assert(NULL != piSkip);

    const MDL::Header *pcHeader = (const MDL::Header*)mBuffer;  //the endianness is already corrected in the InternReadFile_3DGS_MDL345 function

    if (iType == 1 || iType > 3)
    {
        ASSIMP_LOG_ERROR("Unsupported texture file format");
        return;
    }

    const bool bNoRead = *piSkip == UINT_MAX;

    // allocate a new texture object
    aiTexture* pcNew = new aiTexture();
    pcNew->mWidth = pcHeader->skinwidth;
    pcNew->mHeight = pcHeader->skinheight;

    if (bNoRead)pcNew->pcData = bad_texel;
    ParseTextureColorData(szData,iType,piSkip,pcNew);

    // store the texture
    if (!bNoRead)
    {
        if (!this->pScene->mNumTextures)
        {
            pScene->mNumTextures = 1;
            pScene->mTextures = new aiTexture*[1];
            pScene->mTextures[0] = pcNew;
        }
        else
        {
            aiTexture** pc = pScene->mTextures;
            pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
            for (unsigned int i = 0; i < this->pScene->mNumTextures;++i)
                pScene->mTextures[i] = pc[i];
            pScene->mTextures[pScene->mNumTextures] = pcNew;
            pScene->mNumTextures++;
            delete[] pc;
        }
    }
    else {
        pcNew->pcData = NULL;
        delete pcNew;
    }
    return;
}